

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O1

void add(uint8_t *out,size_t nout,uint8_t *in,size_t nin)

{
  long lVar1;
  uint uVar2;
  
  if (in < (uint8_t *)0x38) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + out[lVar1 + 0x36];
      if (0 < (int)in + (int)lVar1) {
        uVar2 = uVar2 + *(byte *)(nout + ((ulong)((int)in - 1) + lVar1 & 0xffffffff));
      }
      out[lVar1 + 0x36] = (uint8_t)uVar2;
      uVar2 = uVar2 >> 8;
      lVar1 = lVar1 + -1;
    } while (lVar1 != -0x37);
    return;
  }
  abort();
}

Assistant:

static void add(uint8_t *out, size_t nout, const uint8_t *in, size_t nin)
{
  assert(nout >= nin);

  uint16_t carry = 0;
  int oi, ii;

  for (oi = nout - 1, ii = nin - 1;
       oi >= 0;
       ii--, oi--)
  {
    carry += out[oi];
    if (ii >= 0)
      carry += in[ii];
    out[oi] = carry & 0xff;
    carry >>= 8;
  }
}